

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::CornerCoordinates
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,
          TPZFMatrix<double> *coord)

{
  long lVar1;
  TPZGeoNode *pTVar2;
  long lVar3;
  long lVar4;
  int i;
  long lVar5;
  
  lVar4 = 0;
  lVar5 = 0;
  do {
    pTVar2 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(((this->super_TPZGeoEl).fMesh)->fNodeVec).
                         super_TPZChunkVector<TPZGeoNode,_10>,
                        (this->fGeo).super_TPZGeoQuad.
                        super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[lVar5]);
    lVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar3 = 0;
    do {
      if ((lVar1 <= lVar3) || ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *(REAL *)((long)coord->fElem + lVar3 * 8 + lVar4 * lVar1) = pTVar2->fCoord[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 8;
    if (lVar5 == 4) {
      return;
    }
  } while( true );
}

Assistant:

inline void TPZGeoElRefLess<TGeo>::CornerCoordinates(TPZFMatrix<REAL> &coord) const
{
    for(int i=0;i<TGeo::NNodes;i++) {
        auto &np = fMesh->NodeVec()[fGeo.fNodeIndexes[i]];
        for(int j=0;j<3;j++) {
            coord(j,i) = np.Coord(j);
        }
    }
}